

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O0

bool __thiscall rudp::session::check_common_header(session *this,buffer_ptr_t *incoming)

{
  byte bVar1;
  vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  *pvVar2;
  byte *pbVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint role_count;
  bool tcs;
  bool chk;
  bool nul;
  bool rst;
  bool eak;
  bool ack;
  bool syn;
  buffer_ptr_t *incoming_local;
  session *this_local;
  
  pvVar2 = &std::
            __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)incoming)->
            super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  ;
  pbVar3 = boost::container::
           vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
           ::operator[](pvVar2,0);
  cVar4 = (*pbVar3 & 0x80) != 0;
  pvVar2 = &std::
            __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)incoming)->
            super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  ;
  pbVar3 = boost::container::
           vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
           ::operator[](pvVar2,0);
  bVar5 = (*pbVar3 & 0x40) != 0;
  pvVar2 = &std::
            __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)incoming)->
            super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  ;
  pbVar3 = boost::container::
           vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
           ::operator[](pvVar2,0);
  bVar6 = (*pbVar3 & 0x20) != 0;
  pvVar2 = &std::
            __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)incoming)->
            super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  ;
  pbVar3 = boost::container::
           vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
           ::operator[](pvVar2,0);
  bVar1 = *pbVar3;
  pvVar2 = &std::
            __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)incoming)->
            super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  ;
  pbVar3 = boost::container::
           vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
           ::operator[](pvVar2,0);
  bVar7 = (*pbVar3 & 8) != 0;
  pvVar2 = &std::
            __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)incoming)->
            super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  ;
  boost::container::
  vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  ::operator[](pvVar2,0);
  pvVar2 = &std::
            __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)incoming)->
            super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  ;
  pbVar3 = boost::container::
           vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
           ::operator[](pvVar2,0);
  if (bVar6) {
    cVar4 = cVar4 + '\x01';
  }
  if ((bVar1 & 0x10) != 0) {
    cVar4 = cVar4 + '\x01';
  }
  if (bVar7) {
    cVar4 = cVar4 + '\x01';
  }
  if ((*pbVar3 & 2) != 0) {
    cVar4 = cVar4 + '\x01';
  }
  if ((cVar4 == '\0') && (bVar5)) {
    cVar4 = '\x01';
  }
  if (((!bVar6) && (!bVar7)) || (bVar5)) {
    this_local._7_1_ = cVar4 == '\x01';
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool session::check_common_header( const buffer_ptr_t &incoming ) {
    const bool syn = (*incoming)[ 0 ] & 0x80;
    const bool ack = (*incoming)[ 0 ] & 0x40;
    const bool eak = (*incoming)[ 0 ] & 0x20;
    const bool rst = (*incoming)[ 0 ] & 0x10;
    const bool nul = (*incoming)[ 0 ] & 0x08;
    const bool chk = (*incoming)[ 0 ] & 0x04;
    const bool tcs = (*incoming)[ 0 ] & 0x02;
    unsigned int role_count = 0u;
    if( syn ) ++role_count;
    if( eak ) ++role_count;
    if( rst ) ++role_count;
    if( nul ) ++role_count;
    if( tcs ) ++role_count;
    if( ( role_count == 0 ) && ack ) ++role_count;
    if( ( eak || nul ) && !ack ) return false;
    return role_count == 1u;
  }